

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderDockWindow(char *window_name,ImGuiID node_id)

{
  ImU32 IVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindowSettings *pIVar3;
  ImGuiID in_ESI;
  char *in_RDI;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  ImGuiID window_id;
  undefined8 in_stack_ffffffffffffffe0;
  ImGuiID IVar4;
  
  IVar4 = (ImGuiID)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  IVar1 = ImHashStr(in_RDI,0,0);
  pIVar2 = FindWindowByID(IVar4);
  IVar4 = (ImGuiID)((ulong)pIVar2 >> 0x20);
  if (pIVar2 == (ImGuiWindow *)0x0) {
    pIVar3 = FindWindowSettings(IVar4);
    if (pIVar3 == (ImGuiWindowSettings *)0x0) {
      pIVar3 = CreateNewWindowSettings(window_name);
    }
    pIVar3->DockId = in_ESI;
    pIVar3->DockOrder = -1;
  }
  else {
    SetWindowDock((ImGuiWindow *)CONCAT44(in_ESI,IVar1),IVar4,(ImGuiCond)pIVar2);
    pIVar2->DockOrder = -1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderDockWindow(const char* window_name, ImGuiID node_id)
{
    // We don't preserve relative order of multiple docked windows (by clearing DockOrder back to -1)
    ImGuiID window_id = ImHashStr(window_name);
    if (ImGuiWindow* window = FindWindowByID(window_id))
    {
        // Apply to created window
        SetWindowDock(window, node_id, ImGuiCond_Always);
        window->DockOrder = -1;
    }
    else
    {
        // Apply to settings
        ImGuiWindowSettings* settings = FindWindowSettings(window_id);
        if (settings == NULL)
            settings = CreateNewWindowSettings(window_name);
        settings->DockId = node_id;
        settings->DockOrder = -1;
    }
}